

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_for_each.cpp
# Opt level: O1

container *
anon_unknown.dwarf_16ad67::ParallelForEach::run_for_each
          (container *__return_storage_ptr__,container *src)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  pointer pfVar7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Result_base *p_Var10;
  ulong uVar11;
  pointer this;
  _State_baseV2 *__tmp;
  ulong uVar12;
  bool bVar13;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futures;
  mutex mut;
  __state_type local_e8;
  _func_int **local_d0;
  long *local_c8;
  _func_int **local_c0;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_b8;
  size_type local_98;
  ulong local_90;
  __basic_future<void> local_88;
  container *local_78;
  undefined8 *local_70;
  _func_int **local_68 [2];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_70 = &local_58;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = (_func_int **)
             (src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  local_c0 = (_func_int **)
             (src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  uVar12 = (long)local_c0 - (long)local_d0 >> 2;
  local_78 = __return_storage_ptr__;
  if ((long)uVar12 < 1) {
LAB_00176f4f:
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar3 != piVar4) {
      uVar12 = (long)piVar4 - (long)piVar3 >> 2;
      lVar5 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                (piVar3,piVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                (piVar3,piVar4);
    }
    return __return_storage_ptr__;
  }
  iVar8 = std::thread::hardware_concurrency();
  uVar11 = (ulong)(iVar8 + (uint)(iVar8 == 0));
  if (uVar12 < uVar11) {
    uVar11 = uVar12;
  }
  local_90 = ((uVar12 + uVar11) - 1) / uVar11;
  if (uVar11 * local_90 < uVar12) {
    pstore::assert_failed
              ("partition_size * num_threads >= num_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp"
               ,0x31);
  }
  local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (future<void> *)0x0;
  local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (future<void> *)0x0;
  local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _GLOBAL__N_1::std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
            (&local_b8,uVar11);
  local_98 = uVar11;
  if (local_d0 != local_c0) {
    do {
      uVar11 = local_90;
      if (uVar12 < local_90) {
        uVar11 = uVar12;
      }
      if (0x7ffffffffffffffe < uVar11) {
        pstore::assert_failed
                  ("distance >= 0 && distance < static_cast<udifference_type> ( std::numeric_limits<difference_type>::max ())"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp"
                   ,0x3c);
      }
      local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0022e708;
      peVar2 = (element_type *)(p_Var9 + 1);
      p_Var9[2]._M_use_count = 0;
      p_Var9[1]._M_use_count = 0;
      p_Var9[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var9[1]._M_weak_count + 1) = 0;
      p_Var9[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var9[3]._M_use_count = 0;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0022e758;
      p_Var10 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var10 = 0;
      *(undefined8 *)(p_Var10 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var10);
      pp_Var1 = (_func_int **)((long)local_d0 + uVar11 * 4);
      *(undefined ***)p_Var10 = &PTR__M_destroy_0022eaf8;
      p_Var9[4]._vptr__Sp_counted_base = (_func_int **)p_Var10;
      *(_func_int ***)&p_Var9[4]._M_use_count = pp_Var1;
      p_Var9[5]._vptr__Sp_counted_base = local_d0;
      *(container ***)&p_Var9[5]._M_use_count = &local_78;
      local_68[0] = (_func_int **)0x0;
      local_c8 = (long *)operator_new(0x20);
      *local_c8 = (long)&PTR___State_0022e7b0;
      local_c8[1] = (long)peVar2;
      local_c8[2] = (long)_GLOBAL__N_1::std::__future_base::
                          _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp:67:34),___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>,_void>
                          ::_M_run;
      local_c8[3] = 0;
      std::thread::_M_start_thread(local_68,&local_c8,0);
      if (local_c8 != (long *)0x0) {
        (**(code **)(*local_c8 + 8))();
      }
      _Var6._M_pi = local_e8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      if (p_Var9[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var9[3]._vptr__Sp_counted_base = local_68[0];
      bVar13 = local_e8.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9;
      if (bVar13) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_pi);
      }
      if (local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        p_Var9->_M_use_count = 1;
        p_Var9->_M_weak_count = 1;
        p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0022e7f0;
        p_Var9[2]._M_use_count = 0;
        p_Var9[1]._M_use_count = 0;
        p_Var9[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var9[1]._M_weak_count + 1) = 0;
        p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_0022e840;
        p_Var10 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)p_Var10 = 0;
        *(undefined8 *)(p_Var10 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(p_Var10);
        _Var6._M_pi = local_e8.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        *(undefined ***)p_Var10 = &PTR__M_destroy_0022eaf8;
        p_Var9[3]._vptr__Sp_counted_base = (_func_int **)p_Var10;
        *(_func_int ***)&p_Var9[3]._M_use_count = pp_Var1;
        p_Var9[4]._vptr__Sp_counted_base = local_d0;
        *(container ***)&p_Var9[4]._M_use_count = &local_78;
        bVar13 = local_e8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(p_Var9 + 1);
        local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9;
        if (bVar13) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_pi);
        }
      }
      _GLOBAL__N_1::std::__basic_future<void>::__basic_future(&local_88,&local_e8);
      if (local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_e8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_b8,
                 (future<void> *)&local_88);
      if (local_88._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_88._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pfVar7 = local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar12 = uVar12 - uVar11;
      local_d0 = pp_Var1;
    } while (pp_Var1 != local_c0);
    if (uVar12 == 0) {
      this = local_b8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)local_b8.
                        super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_b8.
                        super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) <= local_98) {
        for (; this != pfVar7; this = this + 1) {
          if ((this->super___basic_future<void>)._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            pstore::assert_failed
                      ("f.valid ()",
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp"
                       ,0x50);
          }
          _GLOBAL__N_1::std::future<void>::get(this);
        }
        _GLOBAL__N_1::std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                  (&local_b8);
        goto LAB_00176f4f;
      }
    }
  }
  pstore::assert_failed
            ("num_elements == 0 && futures.size () <= num_threads",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/parallel_for_each.hpp"
             ,0x4c);
}

Assistant:

auto ParallelForEach::run_for_each (container const & src) -> container {
        std::mutex mut;
        container out;
        pstore::parallel_for_each (std::begin (src), std::end (src), [&out, &mut] (int v) {
            std::lock_guard<std::mutex> _{mut};
            out.emplace_back (v * 2);
        });
        std::sort (std::begin (out), std::end (out), std::less<int> ());
        return out;
    }